

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O3

void TPZReducedSpace::SetAllCreateFunctionsReducedSpace(TPZCompMesh *cmesh)

{
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *this;
  TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10> local_178;
  
  this = local_178.fExtAlloc;
  local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_018f92d8;
  memset(this,0,0x140);
  local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>.fNElements = 8;
  local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>.fNAlloc = 0;
  local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>.fStore = this;
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)this,CreateReducedElement);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)
             (local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>.fStore
             + 1),CreateReducedElement);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)
             (local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>.fStore
             + 3),CreateReducedElement);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)
             (local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>.fStore
             + 2),CreateReducedElement);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)
             (local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>.fStore
             + 6),CreateReducedElement);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)
             (local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>.fStore
             + 4),CreateReducedElement);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)
             (local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>.fStore
             + 5),CreateReducedElement);
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)
             (local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>.fStore
             + 7),CreateReducedElement);
  TPZCreateApproximationSpace::SetCreateFunctions
            (&cmesh->fCreate,
             &local_178.super_TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>);
  TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10>::~TPZManVector(&local_178)
  ;
  return;
}

Assistant:

void TPZReducedSpace::SetAllCreateFunctionsReducedSpace(TPZCompMesh *cmesh)
{
    TPZManVector<TCreateFunction,10> functions(8);
    functions[EPoint] = CreateReducedElement;
	functions[EOned] = CreateReducedElement;
	functions[EQuadrilateral] = CreateReducedElement;
	functions[ETriangle] = CreateReducedElement;
	functions[EPrisma] = CreateReducedElement;
	functions[ETetraedro] = CreateReducedElement;
	functions[EPiramide] = CreateReducedElement;
	functions[ECube] = CreateReducedElement;
    cmesh->ApproxSpace().SetCreateFunctions(functions);
}